

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

void __thiscall cmFileCopier::cmFileCopier(cmFileCopier *this,cmExecutionStatus *status,char *name)

{
  this->_vptr_cmFileCopier = (_func_int **)&PTR__cmFileCopier_007d5638;
  this->Status = status;
  this->Makefile = status->Makefile;
  this->Name = name;
  this->Always = false;
  cmFileTimeCache::cmFileTimeCache(&this->FileTimes);
  this->MatchlessFiles = true;
  this->FilePermissions = 0;
  this->DirPermissions = 0;
  (this->MatchRules).
  super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MatchRules).
  super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MatchRules).
  super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->CurrentMatchRule = (MatchRule *)0x0;
  this->UseGivenPermissionsFile = false;
  this->UseGivenPermissionsDir = false;
  this->UseSourcePermissions = true;
  this->FollowSymlinkChain = false;
  (this->Destination)._M_dataplus._M_p = (pointer)&(this->Destination).field_2;
  (this->Destination)._M_string_length = 0;
  (this->Destination).field_2._M_local_buf[0] = '\0';
  (this->FilesFromDir)._M_dataplus._M_p = (pointer)&(this->FilesFromDir).field_2;
  (this->FilesFromDir)._M_string_length = 0;
  (this->FilesFromDir).field_2._M_local_buf[0] = '\0';
  (this->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->Files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->Files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  return;
}

Assistant:

cmFileCopier::cmFileCopier(cmExecutionStatus& status, const char* name)
  : Status(status)
  , Makefile(&status.GetMakefile())
  , Name(name)
{
}